

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testZip(DataFileTest *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  size_t __nbytes;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  const_string *in_RDI;
  uint i_1;
  ComplexInteger record;
  vector<int,_std::allocator<int>_> found;
  DataFileReader<Complex<long>_> reader;
  ComplexInteger d;
  size_t i;
  DataFileWriter<Complex<long>_> writer;
  ValidSchema dschema;
  size_t number_of_objects;
  value_type_conflict3 *in_stack_fffffffffffffe68;
  basic_cstring<const_char> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  Codec in_stack_fffffffffffffe84;
  size_t in_stack_fffffffffffffe88;
  ValidSchema *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *line_num;
  const_string *in_stack_fffffffffffffeb8;
  unit_test_log_t *in_stack_fffffffffffffec0;
  undefined1 local_138 [56];
  basic_cstring<const_char> local_100;
  undefined1 local_ec [28];
  undefined1 local_d0 [56];
  basic_cstring<const_char> local_98;
  undefined4 local_84;
  Complex<long> local_80;
  vector<int,_std::allocator<int>_> local_70;
  DataFileReader<Complex<long>_> local_58;
  Complex<long> local_50;
  ulong local_40;
  DataFileWriter<Complex<long>_> local_28;
  char local_20 [16];
  basic_cstring<const_char> local_10;
  
  local_10.m_begin = (iterator)0x64;
  line_num = local_20;
  avro::compileJsonSchemaFromString(line_num);
  __nbytes = 0x4000;
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            ((DataFileWriter<Complex<long>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  for (local_40 = 0; local_40 < 100; local_40 = local_40 + 1) {
    Complex<long>::Complex(&local_50);
    local_50.re = local_40;
    local_50.im = local_40 * 2;
    avro::DataFileWriter<Complex<long>_>::write(&local_28,(int)&local_50,__buf,__nbytes);
  }
  avro::DataFileWriter<Complex<long>_>::~DataFileWriter((DataFileWriter<Complex<long>_> *)0x249ee0);
  avro::DataFileReader<Complex<long>_>::DataFileReader
            ((DataFileReader<Complex<long>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x249f0c);
  Complex<long>::Complex(&local_80);
  __buf_00 = extraout_RDX;
  while (uVar2 = avro::DataFileReader<Complex<long>_>::read
                           (&local_58,(int)&local_80,__buf_00,__nbytes), (uVar2 & 1) != 0) {
    local_84 = (undefined4)local_80.re;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    __buf_00 = extraout_RDX_00;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(size_t)line_num,in_RDI);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe78,(char (*) [1])in_stack_fffffffffffffe70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_ec + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    local_ec._4_8_ = std::vector<int,_std::allocator<int>_>::size(&local_70);
    in_stack_fffffffffffffe78 = "number_of_objects";
    in_stack_fffffffffffffe70 = &local_10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d0,local_ec + 0xc,0x1ae,1,2,local_ec + 4,"found.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x24a089);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_ec._0_4_ = 0;
  while( true ) {
    uVar2 = (ulong)(uint)local_ec._0_4_;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_70);
    if (sVar3 <= uVar2) break;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe70);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(size_t)line_num,in_RDI);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffe78,(char (*) [1])in_stack_fffffffffffffe70);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffeb8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                 ,0x70);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_70,(ulong)(uint)local_ec._0_4_);
      in_stack_fffffffffffffe78 = "i";
      in_stack_fffffffffffffe70 = (basic_cstring<const_char> *)local_ec;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
                (local_138,&stack0xfffffffffffffeb8,0x1b0,1,2,pvVar4,"found[i]");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x24a1bf);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_ec._0_4_ = local_ec._0_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  avro::DataFileReader<Complex<long>_>::~DataFileReader((DataFileReader<Complex<long>_> *)0x24a241);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x24a24e);
  return;
}

Assistant:

void testZip() {
        const size_t number_of_objects = 100;
        // first create a large file
        ValidSchema dschema = avro::compileJsonSchemaFromString(sch);
        {
            avro::DataFileWriter<ComplexInteger> writer(
              filename, dschema, 16 * 1024, avro::DEFLATE_CODEC);

            for (size_t i = 0; i < number_of_objects; ++i) {
                ComplexInteger d;
                d.re = i;
                d.im = 2 * i;
                writer.write(d);
            }
        }
        {
            avro::DataFileReader<ComplexInteger> reader(filename, dschema);
            std::vector<int> found;
            ComplexInteger record;
            while (reader.read(record)) {
                found.push_back(record.re);
            }
            BOOST_CHECK_EQUAL(found.size(), number_of_objects);
            for (unsigned int i = 0; i < found.size(); ++i) {
                BOOST_CHECK_EQUAL(found[i], i);
            }
        }
    }